

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

char * google::protobuf::internal::WireFormat::_InternalParse
                 (Message *msg,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *this;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  FieldDescriptor *field;
  ExtensionRange *pEVar5;
  char *pcVar6;
  Reflection *this_01;
  uint res;
  byte *pbVar7;
  uint key;
  pair<const_char_*,_unsigned_int> pVar8;
  MessageSetParser message_set;
  LogFinisher local_71;
  byte *local_70;
  Message *local_68;
  Descriptor *local_60;
  Descriptor *this_00;
  
  local_70 = (byte *)ptr;
  iVar3 = (*(msg->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = (Descriptor *)CONCAT44(extraout_var,iVar3);
  (*(msg->super_MessageLite)._vptr_MessageLite[0x11])(msg);
  if (this_00 == (Descriptor *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30e);
    pLVar4 = LogMessage::operator<<((LogMessage *)&local_68,"CHECK failed: descriptor: ");
    LogFinisher::operator=(&local_71,pLVar4);
    LogMessage::~LogMessage((LogMessage *)&local_68);
  }
  if (this_01 == (Reflection *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30f);
    pLVar4 = LogMessage::operator<<((LogMessage *)&local_68,"CHECK failed: reflection: ");
    LogFinisher::operator=(&local_71,pLVar4);
    LogMessage::~LogMessage((LogMessage *)&local_68);
  }
  if (*(char *)(*(long *)(this_00 + 0x20) + 0x48) == '\0') {
    do {
      bVar2 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_70,ctx->group_depth_);
      if (bVar2) {
        return (char *)local_70;
      }
      bVar1 = *local_70;
      res = (uint)bVar1;
      pbVar7 = local_70 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
        if ((char)*pbVar7 < '\0') {
          pVar8 = ReadTagFallback((char *)local_70,res);
          pbVar7 = (byte *)pVar8.first;
          if (pbVar7 == (byte *)0x0) break;
          res = pVar8.second;
        }
        else {
          pbVar7 = local_70 + 2;
        }
      }
      if ((res == 0) || ((res & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pbVar7;
      }
      key = res >> 3;
      local_70 = pbVar7;
      field = Descriptor::FindFieldByNumber(this_00,key);
      if (field == (FieldDescriptor *)0x0) {
        pEVar5 = Descriptor::FindExtensionRangeContainingNumber(this_00,key);
        if (pEVar5 == (ExtensionRange *)0x0) {
          field = (FieldDescriptor *)0x0;
        }
        else {
          this = (ctx->data_).pool;
          if (this == (DescriptorPool *)0x0) {
            field = Reflection::FindKnownExtensionByNumber(this_01,key);
          }
          else {
            field = DescriptorPool::FindExtensionByNumber(this,this_00,key);
          }
        }
      }
      local_70 = (byte *)_InternalParseAndMergeField
                                   (msg,(char *)local_70,ctx,(ulong)res,this_01,field);
    } while (local_70 != (byte *)0x0);
    pcVar6 = (char *)0x0;
  }
  else {
    local_68 = msg;
    local_60 = this_00;
    pcVar6 = MessageSetParser::ParseMessageSet((MessageSetParser *)&local_68,ptr,ctx);
  }
  return pcVar6;
}

Assistant:

const char* WireFormat::_InternalParse(Message* msg, const char* ptr,
                                       internal::ParseContext* ctx) {
  const Descriptor* descriptor = msg->GetDescriptor();
  const Reflection* reflection = msg->GetReflection();
  GOOGLE_DCHECK(descriptor);
  GOOGLE_DCHECK(reflection);
  if (descriptor->options().message_set_wire_format()) {
    MessageSetParser message_set{msg, descriptor, reflection};
    return message_set.ParseMessageSet(ptr, ctx);
  }
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
      ctx->SetLastTag(tag);
      break;
    }
    const FieldDescriptor* field = nullptr;

    int field_number = WireFormatLite::GetTagFieldNumber(tag);
    field = descriptor->FindFieldByNumber(field_number);

    // If that failed, check if the field is an extension.
    if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
      if (ctx->data().pool == nullptr) {
        field = reflection->FindKnownExtensionByNumber(field_number);
      } else {
        field =
            ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
      }
    }

    ptr = _InternalParseAndMergeField(msg, ptr, ctx, tag, reflection, field);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  }
  return ptr;
}